

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildSeqTable(ZSTD_seqSymbol *DTableSpace,ZSTD_seqSymbol **DTablePtr,
                         symbolEncodingType_e type,uint max,U32 maxLog,void *src,size_t srcSize,
                         U32 *baseValue,U8 *nbAdditionalBits,ZSTD_seqSymbol *defaultTable,
                         U32 flagRepeatTable,int ddictIsCold,int nbSeq,U32 *wksp,size_t wkspSize,
                         int bmi2)

{
  uint uVar1;
  U32 *baseValue_00;
  uint in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  byte *in_R9;
  long in_stack_00000008;
  undefined8 in_stack_00000020;
  size_t headerSize;
  S16 norm [53];
  uint tableLog;
  size_t _pos;
  size_t _size;
  char *_ptr;
  size_t pSize;
  void *pStart;
  U8 nbBits;
  U32 baseline;
  U32 symbol;
  void *in_stack_fffffffffffffef8;
  uint *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  ZSTD_seqSymbol *in_stack_ffffffffffffff10;
  short *in_stack_ffffffffffffff28;
  ZSTD_seqSymbol *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  uint local_6c;
  ulong local_68;
  size_t local_8;
  
  baseValue_00 = (U32 *)(ulong)in_EDX;
  switch(baseValue_00) {
  case (U32 *)0x0:
    *in_RSI = in_stack_00000020;
    local_8 = 0;
    break;
  case (U32 *)0x1:
    if (in_stack_00000008 == 0) {
      local_8 = 0xffffffffffffffb8;
    }
    else if (in_ECX < *in_R9) {
      local_8 = 0xffffffffffffffec;
    }
    else {
      ZSTD_buildSeqTable_rle
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 (U8)((uint)in_stack_ffffffffffffff08 >> 0x18));
      *in_RSI = in_RDI;
      local_8 = 1;
    }
    break;
  case (U32 *)0x2:
    local_8 = FSE_readNCount((short *)in_stack_ffffffffffffff10,
                             (uint *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0x2fbe82);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      if (in_R8D < local_6c) {
        local_8 = 0xffffffffffffffec;
      }
      else {
        ZSTD_buildFSETable(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           (uint)(local_8 >> 0x20),baseValue_00,(U8 *)in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff0c,in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
        *in_RSI = in_RDI;
      }
    }
    else {
      local_8 = 0xffffffffffffffec;
    }
    break;
  case (U32 *)0x3:
    if ((int)headerSize == 0) {
      local_8 = 0xffffffffffffffec;
    }
    else {
      if ((norm._0_4_ != 0) && (0x18 < (int)norm._8_4_)) {
        for (local_68 = 0; local_68 < (ulong)((long)((1 << ((byte)in_R8D & 0x1f)) + 1) << 3);
            local_68 = local_68 + 0x40) {
        }
      }
      local_8 = 0;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa713,
                  "size_t ZSTD_buildSeqTable(ZSTD_seqSymbol *, const ZSTD_seqSymbol **, symbolEncodingType_e, unsigned int, U32, const void *, size_t, const U32 *, const U8 *, const ZSTD_seqSymbol *, U32, int, int, U32 *, size_t, int)"
                 );
  }
  return local_8;
}

Assistant:

static size_t ZSTD_buildSeqTable(ZSTD_seqSymbol* DTableSpace, const ZSTD_seqSymbol** DTablePtr,
                                 symbolEncodingType_e type, unsigned max, U32 maxLog,
                                 const void* src, size_t srcSize,
                                 const U32* baseValue, const U8* nbAdditionalBits,
                                 const ZSTD_seqSymbol* defaultTable, U32 flagRepeatTable,
                                 int ddictIsCold, int nbSeq, U32* wksp, size_t wkspSize,
                                 int bmi2)
{
    switch(type)
    {
    case set_rle :
        RETURN_ERROR_IF(!srcSize, srcSize_wrong, "");
        RETURN_ERROR_IF((*(const BYTE*)src) > max, corruption_detected, "");
        {   U32 const symbol = *(const BYTE*)src;
            U32 const baseline = baseValue[symbol];
            U8 const nbBits = nbAdditionalBits[symbol];
            ZSTD_buildSeqTable_rle(DTableSpace, baseline, nbBits);
        }
        *DTablePtr = DTableSpace;
        return 1;
    case set_basic :
        *DTablePtr = defaultTable;
        return 0;
    case set_repeat:
        RETURN_ERROR_IF(!flagRepeatTable, corruption_detected, "");
        /* prefetch FSE table if used */
        if (ddictIsCold && (nbSeq > 24 /* heuristic */)) {
            const void* const pStart = *DTablePtr;
            size_t const pSize = sizeof(ZSTD_seqSymbol) * (SEQSYMBOL_TABLE_SIZE(maxLog));
            PREFETCH_AREA(pStart, pSize);
        }
        return 0;
    case set_compressed :
        {   unsigned tableLog;
            S16 norm[MaxSeq+1];
            size_t const headerSize = FSE_readNCount(norm, &max, &tableLog, src, srcSize);
            RETURN_ERROR_IF(FSE_isError(headerSize), corruption_detected, "");
            RETURN_ERROR_IF(tableLog > maxLog, corruption_detected, "");
            ZSTD_buildFSETable(DTableSpace, norm, max, baseValue, nbAdditionalBits, tableLog, wksp, wkspSize, bmi2);
            *DTablePtr = DTableSpace;
            return headerSize;
        }
    default :
        assert(0);
        RETURN_ERROR(GENERIC, "impossible");
    }
}